

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::v5::file::close(file *this,int __fd)

{
  int iVar1;
  char *s;
  int *piVar2;
  int in_stack_0000001c;
  system_error *in_stack_00000020;
  undefined1 in_stack_00000028 [16];
  int result;
  undefined4 in_stack_ffffffffffffffc0;
  
  if (this->fd_ != -1) {
    iVar1 = ::close(this->fd_);
    this->fd_ = -1;
    if (iVar1 != 0) {
      s = (char *)__cxa_allocate_exception(0x18);
      piVar2 = __errno_location();
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)CONCAT44(*piVar2,in_stack_ffffffffffffffc0),s);
      system_error::system_error<>
                (in_stack_00000020,in_stack_0000001c,(string_view)in_stack_00000028);
      __cxa_throw(s,&system_error::typeinfo,system_error::~system_error);
    }
  }
  return (int)this;
}

Assistant:

void file::close() {
  if (fd_ == -1)
    return;
  // Don't retry close in case of EINTR!
  // See http://linux.derkeiler.com/Mailing-Lists/Kernel/2005-09/3000.html
  int result = FMT_POSIX_CALL(close(fd_));
  fd_ = -1;
  if (result != 0)
    FMT_THROW(system_error(errno, "cannot close file"));
}